

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O0

void __thiscall
soplex::LPRowSetBase<double>::LPRowSetBase(LPRowSetBase<double> *this,int pmax,int pmemmax)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  DataArray<int> *in_RDI;
  SVSetBase<double> *unaff_retaddr;
  pointer *p_fac;
  undefined8 in_stack_ffffffffffffffc8;
  int p_dimen;
  pointer *ppdVar1;
  double in_stack_ffffffffffffffe8;
  
  p_dimen = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  SVSetBase<double>::SVSetBase
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(double)CONCAT44(in_ESI,in_EDX),
             in_stack_ffffffffffffffe8);
  *(undefined ***)in_RDI = &PTR__LPRowSetBase_00896cc8;
  VectorBase<double>::VectorBase((VectorBase<double> *)in_RDI,p_dimen);
  ppdVar1 = (pointer *)&in_RDI[5].data;
  VectorBase<double>::VectorBase((VectorBase<double> *)in_RDI,(int)((ulong)ppdVar1 >> 0x20));
  p_fac = (pointer *)&in_RDI[6].data;
  VectorBase<double>::VectorBase((VectorBase<double> *)in_RDI,(int)((ulong)ppdVar1 >> 0x20));
  DataArray<int>::DataArray(in_RDI,(int)((ulong)ppdVar1 >> 0x20),(int)ppdVar1,(Real)p_fac);
  return;
}

Assistant:

explicit
   LPRowSetBase(int pmax = -1, int pmemmax = -1)
      : SVSetBase<R>(pmax, pmemmax), left(0), right(0), object(0), scaleExp(0)
   {
      assert(isConsistent());
   }